

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress4X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined2 *puVar1;
  undefined2 *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined2 uVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  BIT_DStream_status BVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  undefined2 *puVar16;
  undefined2 *puVar17;
  uint uVar18;
  size_t sVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  void *pvVar26;
  undefined2 *puVar27;
  bool bVar28;
  size_t sStack_1c0;
  undefined2 *local_198;
  int local_18c;
  size_t *local_170;
  size_t *local_160;
  size_t *local_158;
  size_t *local_150;
  size_t local_148;
  size_t local_140;
  BIT_DStream_t local_138;
  BIT_DStream_t local_110;
  BIT_DStream_t local_e8;
  BIT_DStream_t local_c0;
  undefined2 *local_98;
  size_t local_90;
  undefined2 *local_88;
  size_t local_80;
  size_t *local_78;
  size_t *local_70;
  size_t *local_68;
  size_t *local_60;
  ulong local_58;
  undefined1 *local_50;
  ulong local_48;
  undefined1 *local_40;
  size_t local_38;
  
  if (cSrcSize < 10) {
    sStack_1c0 = 0xffffffffffffffec;
  }
  else {
    uVar25 = (ulong)*cSrc;
    uVar23 = (ulong)*(ushort *)((long)cSrc + 2);
    uVar22 = (ulong)*(ushort *)((long)cSrc + 4);
    uVar15 = uVar22 + 6 + uVar25 + uVar23;
    sStack_1c0 = 0xffffffffffffffec;
    if (uVar15 <= cSrcSize) {
      uVar6 = *(undefined2 *)((long)DTable + 2);
      local_90 = dstSize;
      sStack_1c0 = BIT_initDStream(&local_138,(void *)((long)cSrc + 6),uVar25);
      if (sStack_1c0 < 0xffffffffffffff89) {
        pvVar26 = (void *)((long)cSrc + uVar25 + 6);
        sStack_1c0 = BIT_initDStream(&local_c0,pvVar26,uVar23);
        if (sStack_1c0 < 0xffffffffffffff89) {
          pvVar26 = (void *)((long)pvVar26 + uVar23);
          sStack_1c0 = BIT_initDStream(&local_e8,pvVar26,uVar22);
          if ((sStack_1c0 < 0xffffffffffffff89) &&
             (sStack_1c0 = BIT_initDStream(&local_110,(void *)((long)pvVar26 + uVar22),
                                           cSrcSize - uVar15), sStack_1c0 < 0xffffffffffffff89)) {
            local_98 = (undefined2 *)((long)dst + local_90);
            local_88 = (undefined2 *)((long)dst + (local_90 - 7));
            uVar15 = local_90 + 3 >> 2;
            puVar1 = (undefined2 *)((long)dst + uVar15);
            puVar2 = (undefined2 *)((long)puVar1 + uVar15);
            puVar16 = (undefined2 *)(uVar15 + (long)puVar2);
            local_148 = local_c0.bitContainer;
            local_140 = local_110.bitContainer;
            bVar8 = -(char)uVar6;
            bVar7 = bVar8 & 0x3f;
            local_60 = (size_t *)local_138.limitPtr;
            local_68 = (size_t *)local_c0.limitPtr;
            local_70 = (size_t *)local_e8.limitPtr;
            local_78 = (size_t *)local_110.limitPtr;
            local_158 = (size_t *)local_138.ptr;
            local_170 = (size_t *)local_c0.ptr;
            local_150 = (size_t *)local_e8.ptr;
            bVar28 = true;
            local_160 = (size_t *)local_110.ptr;
            puVar17 = puVar16;
            sVar19 = local_e8.bitContainer;
            puVar27 = puVar2;
            local_198 = puVar1;
            while ((local_e8.bitContainer = sVar19, puVar17 < local_88 && (bVar28))) {
              uVar15 = (local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >> bVar7;
              *(short *)dst = (short)DTable[uVar15 + 1];
              iVar20 = *(byte *)((long)DTable + uVar15 * 4 + 6) + local_138.bitsConsumed;
              uVar22 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar7;
              uVar15 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
              *(short *)((long)dst + uVar15) = (short)DTable[uVar22 + 1];
              iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
              uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
              uVar23 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar7;
              local_40 = (undefined1 *)((long)dst + uVar22 + uVar15);
              *(short *)((long)dst + uVar22 + uVar15) = (short)DTable[uVar23 + 1];
              iVar20 = (uint)*(byte *)((long)DTable + uVar23 * 4 + 6) + iVar20;
              local_48 = (ulong)*(byte *)((long)DTable + uVar23 * 4 + 7);
              uVar15 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar7;
              *(short *)(local_40 + local_48) = (short)DTable[uVar15 + 1];
              local_138.bitsConsumed = (uint)*(byte *)((long)DTable + uVar15 * 4 + 6) + iVar20;
              uVar22 = (local_148 << ((byte)local_c0.bitsConsumed & 0x3f)) >> bVar7;
              bVar3 = *(byte *)((long)DTable + uVar15 * 4 + 7);
              *local_198 = (short)DTable[uVar22 + 1];
              iVar20 = *(byte *)((long)DTable + uVar22 * 4 + 6) + local_c0.bitsConsumed;
              uVar15 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
              uVar22 = (local_148 << ((byte)iVar20 & 0x3f)) >> bVar7;
              *(short *)((long)local_198 + uVar15) = (short)DTable[uVar22 + 1];
              iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
              uVar23 = (local_148 << ((byte)iVar20 & 0x3f)) >> bVar7;
              uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
              *(short *)((long)local_198 + uVar22 + uVar15) = (short)DTable[uVar23 + 1];
              local_50 = (undefined1 *)((long)local_198 + uVar22 + uVar15);
              iVar20 = (uint)*(byte *)((long)DTable + uVar23 * 4 + 6) + iVar20;
              uVar15 = (local_148 << ((byte)iVar20 & 0x3f)) >> bVar7;
              local_58 = (ulong)*(byte *)((long)DTable + uVar23 * 4 + 7);
              *(short *)(local_50 + local_58) = (short)DTable[uVar15 + 1];
              if (local_158 < local_138.limitPtr) {
                local_18c = 3;
              }
              else {
                local_158 = (size_t *)((long)local_158 - (ulong)(local_138.bitsConsumed >> 3));
                local_138.bitsConsumed = local_138.bitsConsumed & 7;
                local_138.bitContainer = *local_158;
                local_18c = 0;
              }
              local_c0.bitsConsumed = iVar20 + (uint)*(byte *)((long)DTable + uVar15 * 4 + 6);
              bVar4 = *(byte *)((long)DTable + uVar15 * 4 + 7);
              if (local_170 < local_c0.limitPtr) {
                iVar20 = 3;
              }
              else {
                local_170 = (size_t *)((long)local_170 - (ulong)(local_c0.bitsConsumed >> 3));
                local_c0.bitsConsumed = local_c0.bitsConsumed & 7;
                local_148 = *local_170;
                iVar20 = 0;
              }
              uVar15 = (local_e8.bitContainer << ((byte)local_e8.bitsConsumed & 0x3f)) >> bVar7;
              *puVar27 = (short)DTable[uVar15 + 1];
              iVar21 = *(byte *)((long)DTable + uVar15 * 4 + 6) + local_e8.bitsConsumed;
              uVar22 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
              uVar15 = (local_e8.bitContainer << ((byte)iVar21 & 0x3f)) >> bVar7;
              *(short *)((long)puVar27 + uVar22) = (short)DTable[uVar15 + 1];
              iVar21 = (uint)*(byte *)((long)DTable + uVar15 * 4 + 6) + iVar21;
              uVar23 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
              lVar9 = uVar23 + uVar22;
              uVar15 = (local_e8.bitContainer << ((byte)iVar21 & 0x3f)) >> bVar7;
              *(short *)((long)puVar27 + uVar23 + uVar22) = (short)DTable[uVar15 + 1];
              iVar21 = (uint)*(byte *)((long)DTable + uVar15 * 4 + 6) + iVar21;
              uVar22 = (local_e8.bitContainer << ((byte)iVar21 & 0x3f)) >> bVar7;
              uVar25 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
              *(short *)((long)puVar27 + uVar25 + lVar9) = (short)DTable[uVar22 + 1];
              local_e8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar21;
              bVar5 = *(byte *)((long)DTable + uVar22 * 4 + 7);
              uVar22 = (local_140 << ((byte)local_110.bitsConsumed & 0x3f)) >> bVar7;
              *puVar17 = (short)DTable[uVar22 + 1];
              iVar21 = *(byte *)((long)DTable + uVar22 * 4 + 6) + local_110.bitsConsumed;
              uVar15 = (local_140 << ((byte)iVar21 & 0x3f)) >> bVar7;
              uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
              *(short *)((long)puVar17 + uVar22) = (short)DTable[uVar15 + 1];
              iVar21 = (uint)*(byte *)((long)DTable + uVar15 * 4 + 6) + iVar21;
              uVar15 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
              uVar23 = (local_140 << ((byte)iVar21 & 0x3f)) >> bVar7;
              *(short *)((long)puVar17 + uVar15 + uVar22) = (short)DTable[uVar23 + 1];
              lVar10 = uVar15 + uVar22;
              iVar21 = (uint)*(byte *)((long)DTable + uVar23 * 4 + 6) + iVar21;
              uVar15 = (ulong)*(byte *)((long)DTable + uVar23 * 4 + 7);
              uVar22 = (local_140 << ((byte)iVar21 & 0x3f)) >> bVar7;
              *(short *)((long)puVar17 + uVar15 + lVar10) = (short)DTable[uVar22 + 1];
              if (local_150 < local_e8.limitPtr) {
                iVar12 = 3;
                sVar19 = local_e8.bitContainer;
              }
              else {
                local_150 = (size_t *)((long)local_150 - (ulong)(local_e8.bitsConsumed >> 3));
                local_e8.bitsConsumed = local_e8.bitsConsumed & 7;
                iVar12 = 0;
                sVar19 = *local_150;
              }
              local_110.bitsConsumed = iVar21 + (uint)*(byte *)((long)DTable + uVar22 * 4 + 6);
              if (local_160 < local_110.limitPtr) {
                iVar21 = 3;
              }
              else {
                local_160 = (size_t *)((long)local_160 - (ulong)(local_110.bitsConsumed >> 3));
                local_110.bitsConsumed = local_110.bitsConsumed & 7;
                local_140 = *local_160;
                iVar21 = 0;
              }
              dst = local_40 + bVar3 + local_48;
              local_198 = (undefined2 *)(local_50 + bVar4 + local_58);
              puVar27 = (undefined2 *)((long)puVar27 + (ulong)bVar5 + uVar25 + lVar9);
              puVar17 = (undefined2 *)
                        ((long)puVar17 +
                        (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7) + uVar15 + lVar10);
              bVar28 = ((iVar20 == 0 && local_18c == 0) && iVar12 == 0) && iVar21 == 0;
              local_80 = local_e8.bitContainer;
              local_38 = local_138.bitContainer;
            }
            local_138.ptr = (char *)local_158;
            local_c0.ptr = (char *)local_170;
            local_e8.ptr = (char *)local_150;
            local_110.ptr = (char *)local_160;
            local_c0.bitContainer = local_148;
            local_110.bitContainer = local_140;
            if (puVar1 < dst) {
              sStack_1c0 = 0xffffffffffffffec;
            }
            else {
              sStack_1c0 = 0xffffffffffffffec;
              if ((local_198 <= puVar2) && (sStack_1c0 = 0xffffffffffffffec, puVar27 <= puVar16)) {
                while ((BVar11 = BIT_reloadDStream(&local_138),
                       dst < (undefined2 *)((long)puVar1 - 7U) && (BVar11 == BIT_DStream_unfinished)
                       )) {
                  uVar15 = (local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *(short *)dst = (short)DTable[uVar15 + 1];
                  iVar20 = *(byte *)((long)DTable + uVar15 * 4 + 6) + local_138.bitsConsumed;
                  uVar15 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
                  uVar22 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)dst + uVar15) = (short)DTable[uVar22 + 1];
                  iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
                  uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
                  lVar9 = uVar22 + uVar15;
                  uVar23 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)dst + uVar22 + uVar15) = (short)DTable[uVar23 + 1];
                  iVar20 = (uint)*(byte *)((long)DTable + uVar23 * 4 + 6) + iVar20;
                  uVar15 = (ulong)*(byte *)((long)DTable + uVar23 * 4 + 7);
                  uVar22 = (local_138.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)dst + uVar15 + lVar9) = (short)DTable[uVar22 + 1];
                  local_138.bitsConsumed = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
                  dst = (void *)((long)dst +
                                (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7) + uVar15 + lVar9);
                }
                while ((BVar11 = BIT_reloadDStream(&local_138), dst <= puVar1 + -1 &&
                       (BVar11 == BIT_DStream_unfinished))) {
                  uVar15 = (local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *(short *)dst = (short)DTable[uVar15 + 1];
                  local_138.bitsConsumed =
                       *(byte *)((long)DTable + uVar15 * 4 + 6) + local_138.bitsConsumed;
                  dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7));
                }
                for (; dst <= puVar1 + -1;
                    dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7))) {
                  uVar15 = (local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *(short *)dst = (short)DTable[uVar15 + 1];
                  local_138.bitsConsumed =
                       local_138.bitsConsumed + *(byte *)((long)DTable + uVar15 * 4 + 6);
                }
                uVar18 = local_138.bitsConsumed;
                if (dst < puVar1) {
                  uVar15 = (local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *(char *)dst = (char)DTable[uVar15 + 1];
                  if (*(char *)((long)DTable + uVar15 * 4 + 7) == '\x01') {
                    uVar18 = local_138.bitsConsumed + *(byte *)((long)DTable + uVar15 * 4 + 6);
                  }
                  else if ((local_138.bitsConsumed < 0x40) &&
                          (uVar18 = local_138.bitsConsumed +
                                    *(byte *)((long)DTable + uVar15 * 4 + 6), 0x3f < uVar18)) {
                    uVar18 = 0x40;
                  }
                }
                local_138.bitsConsumed = uVar18;
                while ((BVar11 = BIT_reloadDStream(&local_c0),
                       local_198 < (undefined2 *)((long)puVar2 - 7U) &&
                       (BVar11 == BIT_DStream_unfinished))) {
                  uVar15 = (local_c0.bitContainer << ((byte)local_c0.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *local_198 = (short)DTable[uVar15 + 1];
                  iVar20 = *(byte *)((long)DTable + uVar15 * 4 + 6) + local_c0.bitsConsumed;
                  uVar15 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
                  uVar22 = (local_c0.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)local_198 + uVar15) = (short)DTable[uVar22 + 1];
                  iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
                  uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
                  lVar9 = uVar22 + uVar15;
                  uVar23 = (local_c0.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)local_198 + uVar22 + uVar15) = (short)DTable[uVar23 + 1];
                  iVar20 = (uint)*(byte *)((long)DTable + uVar23 * 4 + 6) + iVar20;
                  uVar15 = (ulong)*(byte *)((long)DTable + uVar23 * 4 + 7);
                  uVar22 = (local_c0.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)local_198 + uVar15 + lVar9) = (short)DTable[uVar22 + 1];
                  local_c0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
                  local_198 = (undefined2 *)
                              ((long)local_198 +
                              (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7) + uVar15 + lVar9);
                }
                while ((BVar11 = BIT_reloadDStream(&local_c0), uVar24 = local_c0.bitsConsumed,
                       local_198 <= puVar2 + -1 && (BVar11 == BIT_DStream_unfinished))) {
                  uVar15 = (local_c0.bitContainer << ((byte)local_c0.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *local_198 = (short)DTable[uVar15 + 1];
                  local_c0.bitsConsumed =
                       *(byte *)((long)DTable + uVar15 * 4 + 6) + local_c0.bitsConsumed;
                  local_198 = (undefined2 *)
                              ((long)local_198 + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7));
                }
                for (; local_198 <= puVar2 + -1;
                    local_198 = (undefined2 *)
                                ((long)local_198 + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7)))
                {
                  uVar15 = (local_c0.bitContainer << ((byte)uVar24 & 0x3f)) >> (bVar8 & 0x3f);
                  *local_198 = (short)DTable[uVar15 + 1];
                  uVar24 = uVar24 + *(byte *)((long)DTable + uVar15 * 4 + 6);
                }
                if (local_198 < puVar2) {
                  uVar15 = (local_c0.bitContainer << ((byte)uVar24 & 0x3f)) >> (bVar8 & 0x3f);
                  *(char *)local_198 = (char)DTable[uVar15 + 1];
                  if (*(char *)((long)DTable + uVar15 * 4 + 7) == '\x01') {
                    uVar24 = uVar24 + *(byte *)((long)DTable + uVar15 * 4 + 6);
                  }
                  else if ((uVar24 < 0x40) &&
                          (uVar24 = uVar24 + *(byte *)((long)DTable + uVar15 * 4 + 6), 0x3f < uVar24
                          )) {
                    uVar24 = 0x40;
                  }
                }
                while ((BVar11 = BIT_reloadDStream(&local_e8),
                       puVar27 < (undefined2 *)((long)puVar16 - 7U) &&
                       (BVar11 == BIT_DStream_unfinished))) {
                  uVar15 = (local_e8.bitContainer << ((byte)local_e8.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *puVar27 = (short)DTable[uVar15 + 1];
                  iVar20 = *(byte *)((long)DTable + uVar15 * 4 + 6) + local_e8.bitsConsumed;
                  uVar15 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
                  uVar22 = (local_e8.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)puVar27 + uVar15) = (short)DTable[uVar22 + 1];
                  iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
                  uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
                  lVar9 = uVar22 + uVar15;
                  uVar23 = (local_e8.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)puVar27 + uVar22 + uVar15) = (short)DTable[uVar23 + 1];
                  iVar20 = (uint)*(byte *)((long)DTable + uVar23 * 4 + 6) + iVar20;
                  uVar15 = (ulong)*(byte *)((long)DTable + uVar23 * 4 + 7);
                  uVar22 = (local_e8.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)puVar27 + uVar15 + lVar9) = (short)DTable[uVar22 + 1];
                  local_e8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
                  puVar27 = (undefined2 *)
                            ((long)puVar27 +
                            (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7) + uVar15 + lVar9);
                }
                while ((BVar11 = BIT_reloadDStream(&local_e8), uVar14 = local_e8.bitsConsumed,
                       puVar27 <= puVar16 + -1 && (BVar11 == BIT_DStream_unfinished))) {
                  uVar15 = (local_e8.bitContainer << ((byte)local_e8.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *puVar27 = (short)DTable[uVar15 + 1];
                  local_e8.bitsConsumed =
                       *(byte *)((long)DTable + uVar15 * 4 + 6) + local_e8.bitsConsumed;
                  puVar27 = (undefined2 *)
                            ((long)puVar27 + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7));
                }
                for (; puVar27 <= puVar16 + -1;
                    puVar27 = (undefined2 *)
                              ((long)puVar27 + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7))) {
                  uVar15 = (local_e8.bitContainer << ((byte)uVar14 & 0x3f)) >> (bVar8 & 0x3f);
                  *puVar27 = (short)DTable[uVar15 + 1];
                  uVar14 = uVar14 + *(byte *)((long)DTable + uVar15 * 4 + 6);
                }
                if (puVar27 < puVar16) {
                  uVar15 = (local_e8.bitContainer << ((byte)uVar14 & 0x3f)) >> (bVar8 & 0x3f);
                  *(char *)puVar27 = (char)DTable[uVar15 + 1];
                  if (*(char *)((long)DTable + uVar15 * 4 + 7) == '\x01') {
                    uVar14 = uVar14 + *(byte *)((long)DTable + uVar15 * 4 + 6);
                  }
                  else if (uVar14 < 0x40) {
                    uVar14 = uVar14 + *(byte *)((long)DTable + uVar15 * 4 + 6);
                    if (0x3f < uVar14) {
                      uVar14 = 0x40;
                    }
                  }
                }
                while ((BVar11 = BIT_reloadDStream(&local_110), puVar17 < local_88 &&
                       (BVar11 == BIT_DStream_unfinished))) {
                  uVar15 = (local_110.bitContainer << ((byte)local_110.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *puVar17 = (short)DTable[uVar15 + 1];
                  iVar20 = *(byte *)((long)DTable + uVar15 * 4 + 6) + local_110.bitsConsumed;
                  uVar15 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
                  uVar22 = (local_110.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)puVar17 + uVar15) = (short)DTable[uVar22 + 1];
                  iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
                  uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
                  lVar9 = uVar22 + uVar15;
                  uVar23 = (local_110.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)puVar17 + uVar22 + uVar15) = (short)DTable[uVar23 + 1];
                  iVar20 = (uint)*(byte *)((long)DTable + uVar23 * 4 + 6) + iVar20;
                  uVar15 = (ulong)*(byte *)((long)DTable + uVar23 * 4 + 7);
                  uVar22 = (local_110.bitContainer << ((byte)iVar20 & 0x3f)) >> (bVar8 & 0x3f);
                  *(short *)((long)puVar17 + uVar15 + lVar9) = (short)DTable[uVar22 + 1];
                  local_110.bitsConsumed = (uint)*(byte *)((long)DTable + uVar22 * 4 + 6) + iVar20;
                  puVar17 = (undefined2 *)
                            ((long)puVar17 +
                            (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7) + uVar15 + lVar9);
                }
                puVar1 = local_98 + -1;
                while ((BVar11 = BIT_reloadDStream(&local_110), puVar17 <= puVar1 &&
                       (BVar11 == BIT_DStream_unfinished))) {
                  uVar15 = (local_110.bitContainer << ((byte)local_110.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *puVar17 = (short)DTable[uVar15 + 1];
                  local_110.bitsConsumed =
                       *(byte *)((long)DTable + uVar15 * 4 + 6) + local_110.bitsConsumed;
                  puVar17 = (undefined2 *)
                            ((long)puVar17 + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7));
                }
                for (; puVar17 <= puVar1;
                    puVar17 = (undefined2 *)
                              ((long)puVar17 + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7))) {
                  uVar15 = (local_110.bitContainer << ((byte)local_110.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *puVar17 = (short)DTable[uVar15 + 1];
                  local_110.bitsConsumed =
                       local_110.bitsConsumed + *(byte *)((long)DTable + uVar15 * 4 + 6);
                }
                if (puVar17 < local_98) {
                  uVar15 = (local_110.bitContainer << ((byte)local_110.bitsConsumed & 0x3f)) >>
                           (bVar8 & 0x3f);
                  *(char *)puVar17 = (char)DTable[uVar15 + 1];
                  if (*(char *)((long)DTable + uVar15 * 4 + 7) == '\x01') {
                    local_110.bitsConsumed =
                         local_110.bitsConsumed + *(byte *)((long)DTable + uVar15 * 4 + 6);
                  }
                  else if (local_110.bitsConsumed < 0x40) {
                    uVar13 = local_110.bitsConsumed + *(byte *)((long)DTable + uVar15 * 4 + 6);
                    local_110.bitsConsumed = 0x40;
                    if (uVar13 < 0x40) {
                      local_110.bitsConsumed = uVar13;
                    }
                  }
                }
                sVar19 = 0xffffffffffffffec;
                if (local_110.bitsConsumed != 0x40) {
                  local_90 = sVar19;
                }
                if (local_110.ptr != local_110.start) {
                  local_90 = sVar19;
                }
                if (uVar14 != 0x40) {
                  local_90 = sVar19;
                }
                if (local_e8.ptr != local_e8.start) {
                  local_90 = sVar19;
                }
                if (uVar24 != 0x40) {
                  local_90 = sVar19;
                }
                if (local_c0.ptr != local_c0.start) {
                  local_90 = sVar19;
                }
                if (uVar18 != 0x40) {
                  local_90 = sVar19;
                }
                sStack_1c0 = local_90;
                if (local_138.ptr != local_138.start) {
                  sStack_1c0 = sVar19;
                }
              }
            }
          }
        }
      }
    }
  }
  return sStack_1c0;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_decompress4X2_usingDTable_internal_body(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    if (cSrcSize < 10) return ERROR(corruption_detected);   /* strict minimum : jump table + 1 byte per stream */

    {   const BYTE* const istart = (const BYTE*) cSrc;
        BYTE* const ostart = (BYTE*) dst;
        BYTE* const oend = ostart + dstSize;
        BYTE* const olimit = oend - (sizeof(size_t)-1);
        const void* const dtPtr = DTable+1;
        const HUF_DEltX2* const dt = (const HUF_DEltX2*)dtPtr;

        /* Init */
        BIT_DStream_t bitD1;
        BIT_DStream_t bitD2;
        BIT_DStream_t bitD3;
        BIT_DStream_t bitD4;
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = cSrcSize - (length1 + length2 + length3 + 6);
        const BYTE* const istart1 = istart + 6;  /* jumpTable */
        const BYTE* const istart2 = istart1 + length1;
        const BYTE* const istart3 = istart2 + length2;
        const BYTE* const istart4 = istart3 + length3;
        size_t const segmentSize = (dstSize+3) / 4;
        BYTE* const opStart2 = ostart + segmentSize;
        BYTE* const opStart3 = opStart2 + segmentSize;
        BYTE* const opStart4 = opStart3 + segmentSize;
        BYTE* op1 = ostart;
        BYTE* op2 = opStart2;
        BYTE* op3 = opStart3;
        BYTE* op4 = opStart4;
        U32 endSignal = 1;
        DTableDesc const dtd = HUF_getDTableDesc(DTable);
        U32 const dtLog = dtd.tableLog;

        if (length4 > cSrcSize) return ERROR(corruption_detected);   /* overflow */
        CHECK_F( BIT_initDStream(&bitD1, istart1, length1) );
        CHECK_F( BIT_initDStream(&bitD2, istart2, length2) );
        CHECK_F( BIT_initDStream(&bitD3, istart3, length3) );
        CHECK_F( BIT_initDStream(&bitD4, istart4, length4) );

        /* 16-32 symbols per loop (4-8 symbols per stream) */
        for ( ; (endSignal) & (op4 < olimit); ) {
#if defined(__clang__) && (defined(__x86_64__) || defined(__i386__))
            HUF_DECODE_SYMBOLX2_2(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_1(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_2(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_0(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_2(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_1(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_2(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_0(op2, &bitD2);
            endSignal &= BIT_reloadDStreamFast(&bitD1) == BIT_DStream_unfinished;
            endSignal &= BIT_reloadDStreamFast(&bitD2) == BIT_DStream_unfinished;
            HUF_DECODE_SYMBOLX2_2(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_1(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_2(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_0(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_2(op4, &bitD4);
            HUF_DECODE_SYMBOLX2_1(op4, &bitD4);
            HUF_DECODE_SYMBOLX2_2(op4, &bitD4);
            HUF_DECODE_SYMBOLX2_0(op4, &bitD4);
            endSignal &= BIT_reloadDStreamFast(&bitD3) == BIT_DStream_unfinished;
            endSignal &= BIT_reloadDStreamFast(&bitD4) == BIT_DStream_unfinished;
#else
            HUF_DECODE_SYMBOLX2_2(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_2(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_2(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_2(op4, &bitD4);
            HUF_DECODE_SYMBOLX2_1(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_1(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_1(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_1(op4, &bitD4);
            HUF_DECODE_SYMBOLX2_2(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_2(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_2(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_2(op4, &bitD4);
            HUF_DECODE_SYMBOLX2_0(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_0(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_0(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_0(op4, &bitD4);
            endSignal = (U32)LIKELY(
                        (BIT_reloadDStreamFast(&bitD1) == BIT_DStream_unfinished)
                      & (BIT_reloadDStreamFast(&bitD2) == BIT_DStream_unfinished)
                      & (BIT_reloadDStreamFast(&bitD3) == BIT_DStream_unfinished)
                      & (BIT_reloadDStreamFast(&bitD4) == BIT_DStream_unfinished));
#endif
        }

        /* check corruption */
        if (op1 > opStart2) return ERROR(corruption_detected);
        if (op2 > opStart3) return ERROR(corruption_detected);
        if (op3 > opStart4) return ERROR(corruption_detected);
        /* note : op4 already verified within main loop */

        /* finish bitStreams one by one */
        HUF_decodeStreamX2(op1, &bitD1, opStart2, dt, dtLog);
        HUF_decodeStreamX2(op2, &bitD2, opStart3, dt, dtLog);
        HUF_decodeStreamX2(op3, &bitD3, opStart4, dt, dtLog);
        HUF_decodeStreamX2(op4, &bitD4, oend,     dt, dtLog);

        /* check */
        { U32 const endCheck = BIT_endOfDStream(&bitD1) & BIT_endOfDStream(&bitD2) & BIT_endOfDStream(&bitD3) & BIT_endOfDStream(&bitD4);
          if (!endCheck) return ERROR(corruption_detected); }

        /* decoded size */
        return dstSize;
    }
}